

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int lws_tls_restrict_borrow(lws_context *context)

{
  int iVar1;
  lws_context *context_local;
  
  if (context->simultaneous_ssl_restriction == 0) {
    context_local._4_4_ = 0;
  }
  else if (context->simultaneous_ssl < context->simultaneous_ssl_restriction) {
    iVar1 = context->simultaneous_ssl + 1;
    context->simultaneous_ssl = iVar1;
    if (iVar1 == context->simultaneous_ssl_restriction) {
      lws_gate_accepts(context,0);
    }
    _lws_log(8,"%s: %d -> %d\n","lws_tls_restrict_borrow",(ulong)(context->simultaneous_ssl - 1),
             (ulong)(uint)context->simultaneous_ssl);
    context_local._4_4_ = 0;
  }
  else {
    _lws_log(4,"%s: tls connection limit %d\n","lws_tls_restrict_borrow",
             (ulong)(uint)context->simultaneous_ssl);
    context_local._4_4_ = 1;
  }
  return context_local._4_4_;
}

Assistant:

int
lws_tls_restrict_borrow(struct lws_context *context)
{
	if (!context->simultaneous_ssl_restriction)
		return 0;

	if (context->simultaneous_ssl >= context->simultaneous_ssl_restriction) {
		lwsl_notice("%s: tls connection limit %d\n", __func__,
			    context->simultaneous_ssl);
		return 1;
	}

	if (++context->simultaneous_ssl == context->simultaneous_ssl_restriction)
		/* that was the last allowed SSL connection */
		lws_gate_accepts(context, 0);

	lwsl_info("%s: %d -> %d\n", __func__,
		  context->simultaneous_ssl - 1,
		  context->simultaneous_ssl);

	return 0;
}